

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::dynamicCheckTestMessage<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  bool bVar1;
  BuilderFor<bool> BVar2;
  BuilderFor<signed_char> BVar3;
  BuilderFor<unsigned_char> BVar4;
  BuilderFor<short> BVar5;
  BuilderFor<unsigned_short> BVar6;
  BuilderFor<int> BVar7;
  BuilderFor<unsigned_int> BVar8;
  uint uVar9;
  BuilderFor<long> BVar10;
  BuilderFor<unsigned_long> BVar11;
  BuilderFor<float> BVar12;
  float fVar13;
  BuilderFor<double> BVar14;
  ArrayPtr<unsigned_char> AVar15;
  BuilderFor<capnp::DynamicEnum> BVar16;
  ArrayPtr<const_char> AVar17;
  Reader RVar18;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<const_char_*> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<const_char_*> expected_25;
  char *local_3808;
  char *local_3800;
  undefined8 local_37f8;
  undefined8 local_37f0;
  StringPtr local_37e8;
  Builder local_37d8;
  ArrayPtr<const_char> local_3798;
  Builder local_3788;
  BuilderFor<capnp::DynamicStruct> local_3748;
  Builder local_3718;
  BuilderFor<capnp::Text> local_36d8;
  bool local_36b9;
  undefined1 auStack_36b8 [7];
  bool _kj_shouldLog_46;
  Builder local_36a8;
  BuilderFor<capnp::DynamicStruct> local_3668;
  Builder local_3638;
  BuilderFor<capnp::Text> local_35f8;
  ArrayPtr<const_char> local_35e0;
  Builder local_35d0;
  BuilderFor<capnp::DynamicStruct> local_3590;
  Builder local_3560;
  BuilderFor<capnp::Text> local_3520;
  bool local_3501;
  undefined1 auStack_3500 [7];
  bool _kj_shouldLog_45;
  Builder local_34f0;
  BuilderFor<capnp::DynamicStruct> local_34b0;
  Builder local_3480;
  BuilderFor<capnp::Text> local_3440;
  ArrayPtr<const_char> local_3428;
  Builder local_3418;
  BuilderFor<capnp::DynamicStruct> local_33d8;
  Builder local_33a8;
  BuilderFor<capnp::Text> local_3368;
  bool local_3349;
  undefined1 auStack_3348 [7];
  bool _kj_shouldLog_44;
  Builder local_3338;
  BuilderFor<capnp::DynamicStruct> local_32f8;
  Builder local_32c8;
  BuilderFor<capnp::Text> local_3288;
  uint local_3270;
  uint local_326c;
  Fault local_3268;
  Fault f_3;
  Builder local_3250;
  undefined1 local_3210 [8];
  BuilderFor<capnp::DynamicList> listReader_3;
  ArrayPtr<const_char> local_3198;
  Builder local_3188;
  undefined1 local_3148 [32];
  Reader local_3128 [2];
  StringPtr local_3108;
  Builder local_30f8;
  bool local_30b1;
  undefined1 local_30b0 [7];
  bool _kj_shouldLog_43;
  Builder local_3070;
  BuilderFor<double> local_3030;
  float local_3028;
  bool local_3021;
  undefined1 local_3020 [7];
  bool _kj_shouldLog_42;
  Builder local_2fe0;
  BuilderFor<double> local_2fa0;
  float local_2f98;
  bool local_2f91;
  undefined1 local_2f90 [7];
  bool _kj_shouldLog_41;
  Builder local_2f50;
  BuilderFor<double> local_2f10;
  double local_2f08;
  bool local_2ef9;
  undefined1 local_2ef8 [7];
  bool _kj_shouldLog_40;
  uint local_2eb8;
  uint local_2eb4;
  Fault local_2eb0;
  Fault f_2;
  Builder local_2e98;
  undefined1 local_2e58 [8];
  BuilderFor<capnp::DynamicList> listReader_2;
  undefined1 local_2e18 [7];
  bool _kj_shouldLog_39;
  Builder local_2dd8;
  BuilderFor<float> local_2d94;
  float local_2d90;
  bool local_2d89;
  undefined1 local_2d88 [7];
  bool _kj_shouldLog_38;
  Builder local_2d48;
  BuilderFor<float> local_2d04;
  float local_2d00;
  bool local_2cf9;
  undefined1 local_2cf8 [7];
  bool _kj_shouldLog_37;
  Builder local_2cb8;
  BuilderFor<float> local_2c74;
  float local_2c70;
  bool local_2c69;
  undefined1 local_2c68 [7];
  bool _kj_shouldLog_36;
  uint local_2c28;
  uint local_2c24;
  Fault local_2c20;
  Fault f_1;
  Builder local_2c08;
  undefined1 local_2bc8 [8];
  BuilderFor<capnp::DynamicList> listReader_1;
  StringPtr local_2b78;
  Builder local_2b68;
  undefined1 local_2b24 [20];
  StringPtr local_2b10;
  Builder local_2b00;
  undefined1 local_2abc [20];
  StringPtr local_2aa8;
  Builder local_2a98;
  undefined1 local_2a52 [18];
  StringPtr local_2a40;
  Builder local_2a30;
  undefined1 local_29f0 [48];
  Builder local_29c0;
  undefined1 local_2980 [40];
  Builder local_2958;
  undefined1 local_2914 [20];
  StringPtr local_2900;
  Builder local_28f0;
  undefined1 local_28aa [18];
  StringPtr local_2898;
  Builder local_2888;
  undefined1 local_2844 [20];
  StringPtr local_2830;
  Builder local_2820;
  ArrayPtr<const_char> local_27e0;
  Builder local_27d0;
  BuilderFor<capnp::DynamicList> local_2790;
  uint local_2754;
  uint local_2750;
  bool local_2749;
  undefined1 auStack_2748 [7];
  bool _kj_shouldLog_35;
  Builder local_2738;
  BuilderFor<capnp::DynamicList> local_26f8;
  Schema local_26c0;
  uint16_t local_26b8;
  ArrayPtr<const_char> local_26b0;
  Builder local_26a0;
  Schema local_2660;
  uint local_2658;
  ArrayPtr<const_char> local_2650;
  bool local_2639;
  Schema SStack_2638;
  bool _kj_shouldLog_34;
  uint16_t local_2630;
  ArrayPtr<const_char> local_2628;
  Builder local_2618;
  Schema local_25d8;
  uint local_25d0;
  ArrayPtr<const_char> local_25c8;
  char *local_25b8;
  undefined1 auStack_25b0 [40];
  StringPtr local_2588;
  Builder local_2578;
  ArrayPtr<const_char> local_2538;
  Builder local_2528;
  BuilderFor<capnp::DynamicStruct> local_24e8;
  Builder local_24b8;
  BuilderFor<capnp::Text> local_2478;
  bool local_2459;
  undefined1 auStack_2458 [7];
  bool _kj_shouldLog_33;
  Builder local_2448;
  BuilderFor<capnp::DynamicStruct> local_2408;
  Builder local_23d8;
  BuilderFor<capnp::Text> local_2398;
  ArrayPtr<const_char> local_2380;
  Builder local_2370;
  BuilderFor<capnp::DynamicStruct> local_2330;
  Builder local_2300;
  BuilderFor<capnp::Text> local_22c0;
  bool local_22a1;
  undefined1 auStack_22a0 [7];
  bool _kj_shouldLog_32;
  Builder local_2290;
  BuilderFor<capnp::DynamicStruct> local_2250;
  Builder local_2220;
  BuilderFor<capnp::Text> local_21e0;
  ArrayPtr<const_char> local_21c8;
  Builder local_21b8;
  BuilderFor<capnp::DynamicStruct> local_2178;
  Builder local_2148;
  BuilderFor<capnp::Text> local_2108;
  bool local_20e9;
  undefined1 auStack_20e8 [7];
  bool _kj_shouldLog_31;
  Builder local_20d8;
  BuilderFor<capnp::DynamicStruct> local_2098;
  Builder local_2068;
  BuilderFor<capnp::Text> local_2028;
  uint local_2010;
  uint local_200c;
  Fault local_2008;
  Fault f;
  Builder local_1ff0;
  undefined1 local_1fb0 [8];
  BuilderFor<capnp::DynamicList> listReader;
  ArrayPtr<const_char> local_1f38;
  Builder local_1f28;
  undefined1 local_1ee8 [32];
  Reader local_1ec8 [2];
  StringPtr local_1ea8;
  Builder local_1e98;
  Builder local_1e58;
  StringPtr local_1e18;
  Builder local_1e08;
  undefined1 local_1dc8 [64];
  Builder local_1d88;
  undefined1 local_1d48 [64];
  Builder local_1d08;
  undefined1 local_1cc8 [48];
  Builder local_1c98;
  undefined1 local_1c58 [40];
  Builder local_1c30;
  undefined1 local_1bec [20];
  StringPtr local_1bd8;
  Builder local_1bc8;
  undefined1 local_1b88 [64];
  Builder local_1b48;
  undefined1 local_1b08 [48];
  Builder local_1ad8;
  undefined1 local_1a98 [40];
  Builder local_1a70;
  undefined1 local_1a2c [20];
  StringPtr local_1a18;
  Builder local_1a08;
  undefined1 local_19c5 [21];
  StringPtr local_19b0;
  Builder local_19a0;
  undefined1 local_195b [19];
  StringPtr local_1948;
  Builder local_1938;
  Schema local_18f8;
  uint16_t local_18f0;
  ArrayPtr<const_char> local_18e8;
  Builder local_18d8;
  Schema local_1898;
  uint local_1890;
  ArrayPtr<const_char> local_1888;
  bool local_1871;
  Schema SStack_1870;
  bool _kj_shouldLog_30;
  uint16_t local_1868;
  ArrayPtr<const_char> local_1860;
  Builder local_1850;
  Schema local_1810;
  uint local_1808;
  ArrayPtr<const_char> local_1800;
  ArrayPtr<const_char> local_17f0;
  ArrayPtr<const_char> local_17e0;
  Builder local_17d0;
  BuilderFor<capnp::DynamicStruct> local_1790;
  Builder local_1760;
  BuilderFor<capnp::Text> local_1720;
  bool local_1701;
  undefined1 auStack_1700 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_16f0;
  Builder local_16e0;
  BuilderFor<capnp::DynamicStruct> local_16a0;
  Builder local_1670;
  BuilderFor<capnp::Text> local_1630;
  ArrayPtr<const_char> local_1618;
  Builder local_1608;
  BuilderFor<capnp::Text> local_15c8;
  bool local_15a9;
  undefined1 auStack_15a8 [7];
  bool _kj_shouldLog_28;
  Builder local_1598;
  BuilderFor<capnp::Text> local_1558;
  ArrayPtr<const_char> local_1540;
  Builder local_1530;
  undefined1 local_14f0 [8];
  BuilderFor<capnp::DynamicStruct> subSubReader;
  Builder local_14b0;
  ArrayPtr<unsigned_char> local_1470;
  ArrayPtr<const_unsigned_char> local_1460;
  bool local_1449;
  undefined1 auStack_1448 [7];
  bool _kj_shouldLog_27;
  Builder local_1438;
  ArrayPtr<unsigned_char> local_13f8;
  ArrayPtr<const_unsigned_char> local_13e8;
  ArrayPtr<const_char> local_13d8;
  Builder local_13c8;
  BuilderFor<capnp::Text> local_1388;
  bool local_1369;
  undefined1 auStack_1368 [7];
  bool _kj_shouldLog_26;
  Builder local_1358;
  BuilderFor<capnp::Text> local_1318;
  int local_12fc;
  ArrayPtr<const_char> local_12f8;
  Builder local_12e8;
  BuilderFor<double> local_12a8;
  bool local_1299;
  undefined1 auStack_1298 [7];
  bool _kj_shouldLog_25;
  Builder local_1288;
  float local_1244;
  ArrayPtr<const_char> local_1240;
  Builder local_1230;
  BuilderFor<float> local_11f0;
  bool local_11e9;
  undefined1 auStack_11e8 [7];
  bool _kj_shouldLog_24;
  Builder local_11d8;
  ArrayPtr<const_char> local_1198;
  Builder local_1188;
  BuilderFor<unsigned_long> local_1148;
  unsigned_long_long local_1140;
  bool local_1131;
  undefined1 auStack_1130 [7];
  bool _kj_shouldLog_23;
  Builder local_1120;
  ArrayPtr<const_char> local_10e0;
  Builder local_10d0;
  BuilderFor<unsigned_int> local_108c;
  uint local_1088;
  bool local_1081;
  undefined1 auStack_1080 [7];
  bool _kj_shouldLog_22;
  Builder local_1070;
  ArrayPtr<const_char> local_1030;
  Builder local_1020;
  BuilderFor<unsigned_short> local_fda;
  uint local_fd8;
  bool local_fd1;
  undefined1 auStack_fd0 [7];
  bool _kj_shouldLog_21;
  Builder local_fc0;
  ArrayPtr<const_char> local_f80;
  Builder local_f70;
  BuilderFor<unsigned_char> local_f29;
  uint local_f28;
  bool local_f21;
  undefined1 auStack_f20 [7];
  bool _kj_shouldLog_20;
  Builder local_f10;
  ArrayPtr<const_char> local_ed0;
  Builder local_ec0;
  BuilderFor<long> local_e80;
  longlong local_e78;
  bool local_e69;
  undefined1 auStack_e68 [7];
  bool _kj_shouldLog_19;
  Builder local_e58;
  ArrayPtr<const_char> local_e18;
  Builder local_e08;
  BuilderFor<int> local_dc4;
  int local_dc0;
  bool local_db9;
  undefined1 auStack_db8 [7];
  bool _kj_shouldLog_18;
  Builder local_da8;
  ArrayPtr<const_char> local_d68;
  Builder local_d58;
  BuilderFor<short> local_d12;
  int local_d10;
  bool local_d09;
  undefined1 auStack_d08 [7];
  bool _kj_shouldLog_17;
  Builder local_cf8;
  ArrayPtr<const_char> local_cb8;
  Builder local_ca8;
  BuilderFor<signed_char> local_c61;
  int local_c60;
  bool local_c59;
  undefined1 auStack_c58 [7];
  bool _kj_shouldLog_16;
  Builder local_c48;
  ArrayPtr<const_char> local_c08;
  Builder local_bf8;
  bool local_bb3;
  bool local_bb2;
  bool local_bb1;
  undefined1 auStack_bb0 [7];
  bool _kj_shouldLog_15;
  Builder local_ba0;
  ArrayPtr<const_char> local_b58;
  Builder local_b48;
  Void local_b03;
  bool local_b02;
  undefined1 auStack_b00 [6];
  bool _kj_shouldLog_14;
  Builder local_af0;
  ArrayPtr<const_char> local_aa8;
  Builder local_a98;
  undefined1 local_a58 [8];
  BuilderFor<capnp::DynamicStruct> subReader;
  Builder local_a18;
  ArrayPtr<unsigned_char> local_9d8;
  ArrayPtr<const_unsigned_char> local_9c8;
  bool local_9b1;
  undefined1 auStack_9b0 [7];
  bool _kj_shouldLog_13;
  Builder local_9a0;
  ArrayPtr<unsigned_char> local_960;
  ArrayPtr<const_unsigned_char> local_950;
  ArrayPtr<const_char> local_940;
  Builder local_930;
  BuilderFor<capnp::Text> local_8f0;
  bool local_8d1;
  undefined1 auStack_8d0 [7];
  bool _kj_shouldLog_12;
  Builder local_8c0;
  BuilderFor<capnp::Text> local_880;
  double local_868;
  ArrayPtr<const_char> local_860;
  Builder local_850;
  BuilderFor<double> local_810;
  bool local_801;
  undefined1 auStack_800 [7];
  bool _kj_shouldLog_11;
  Builder local_7f0;
  float local_7ac;
  ArrayPtr<const_char> local_7a8;
  Builder local_798;
  BuilderFor<float> local_758;
  bool local_751;
  undefined1 auStack_750 [7];
  bool _kj_shouldLog_10;
  Builder local_740;
  ArrayPtr<const_char> local_700;
  Builder local_6f0;
  BuilderFor<unsigned_long> local_6b0;
  unsigned_long_long local_6a8;
  bool local_699;
  undefined1 auStack_698 [7];
  bool _kj_shouldLog_9;
  Builder local_688;
  ArrayPtr<const_char> local_648;
  Builder local_638;
  BuilderFor<unsigned_int> local_5f4;
  uint local_5f0;
  bool local_5e9;
  undefined1 auStack_5e8 [7];
  bool _kj_shouldLog_8;
  Builder local_5d8;
  ArrayPtr<const_char> local_598;
  Builder local_588;
  BuilderFor<unsigned_short> local_542;
  uint local_540;
  bool local_539;
  undefined1 auStack_538 [7];
  bool _kj_shouldLog_7;
  Builder local_528;
  ArrayPtr<const_char> local_4e8;
  Builder local_4d8;
  BuilderFor<unsigned_char> local_491;
  uint local_490;
  bool local_489;
  undefined1 auStack_488 [7];
  bool _kj_shouldLog_6;
  Builder local_478;
  ArrayPtr<const_char> local_438;
  Builder local_428;
  BuilderFor<long> local_3e8;
  longlong local_3e0;
  bool local_3d1;
  undefined1 auStack_3d0 [7];
  bool _kj_shouldLog_5;
  Builder local_3c0;
  ArrayPtr<const_char> local_380;
  Builder local_370;
  BuilderFor<int> local_32c;
  int local_328;
  bool local_321;
  undefined1 auStack_320 [7];
  bool _kj_shouldLog_4;
  Builder local_310;
  ArrayPtr<const_char> local_2d0;
  Builder local_2c0;
  BuilderFor<short> local_27a;
  int local_278;
  bool local_271;
  undefined1 auStack_270 [7];
  bool _kj_shouldLog_3;
  Builder local_260;
  ArrayPtr<const_char> local_220;
  Builder local_210;
  BuilderFor<signed_char> local_1c9;
  int local_1c8;
  bool local_1c1;
  undefined1 auStack_1c0 [7];
  bool _kj_shouldLog_2;
  Builder local_1b0;
  ArrayPtr<const_char> local_170;
  Builder local_160;
  bool local_11b;
  bool local_11a;
  bool local_119;
  undefined1 auStack_118 [7];
  bool _kj_shouldLog_1;
  Builder local_108;
  ArrayPtr<const_char> local_c0;
  Builder local_b0;
  Void local_6f;
  bool local_6e;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_60;
  Builder local_50;
  
  kj::StringPtr::StringPtr((StringPtr *)&local_60,"voidField");
  DynamicStruct::Builder::get(&local_50,(Builder *)&stack0x00000008,(StringPtr)local_60);
  DynamicValue::Builder::as<capnp::Void>(&local_50);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Builder::~Builder(&local_50);
  if (!bVar1) {
    local_6e = kj::_::Debug::shouldLog(ERROR);
    while (local_6e != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_c0,"voidField");
      DynamicStruct::Builder::get(&local_b0,(Builder *)&stack0x00000008,(StringPtr)local_c0);
      DynamicValue::Builder::as<capnp::Void>(&local_b0);
      kj::_::Debug::log<char_const(&)[73],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x152,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", VOID, reader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [73])
                  "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_6f);
      DynamicValue::Builder::~Builder(&local_b0);
      local_6e = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_118,"boolField");
  DynamicStruct::Builder::get(&local_108,(Builder *)&stack0x00000008,(StringPtr)_auStack_118);
  BVar2 = DynamicValue::Builder::as<bool>(&local_108);
  DynamicValue::Builder::~Builder(&local_108);
  if (!BVar2) {
    local_119 = kj::_::Debug::shouldLog(ERROR);
    while (local_119 != false) {
      local_11a = true;
      kj::StringPtr::StringPtr((StringPtr *)&local_170,"boolField");
      DynamicStruct::Builder::get(&local_160,(Builder *)&stack0x00000008,(StringPtr)local_170);
      local_11b = DynamicValue::Builder::as<bool>(&local_160);
      kj::_::Debug::log<char_const(&)[73],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x153,ERROR,
                 "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", true, reader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [73])
                  "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
                 &local_11a,&local_11b);
      DynamicValue::Builder::~Builder(&local_160);
      local_119 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1c0,"int8Field");
  DynamicStruct::Builder::get(&local_1b0,(Builder *)&stack0x00000008,(StringPtr)_auStack_1c0);
  BVar3 = DynamicValue::Builder::as<signed_char>(&local_1b0);
  DynamicValue::Builder::~Builder(&local_1b0);
  if (BVar3 != -0x7b) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      local_1c8 = -0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&local_220,"int8Field");
      DynamicStruct::Builder::get(&local_210,(Builder *)&stack0x00000008,(StringPtr)local_220);
      local_1c9 = DynamicValue::Builder::as<signed_char>(&local_210);
      kj::_::Debug::log<char_const(&)[75],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x154,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", -123, reader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [75])
                  "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
                 &local_1c8,&local_1c9);
      DynamicValue::Builder::~Builder(&local_210);
      local_1c1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_270,"int16Field");
  DynamicStruct::Builder::get(&local_260,(Builder *)&stack0x00000008,(StringPtr)_auStack_270);
  BVar5 = DynamicValue::Builder::as<short>(&local_260);
  DynamicValue::Builder::~Builder(&local_260);
  if (BVar5 != -0x3039) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      local_278 = -0x3039;
      kj::StringPtr::StringPtr((StringPtr *)&local_2d0,"int16Field");
      DynamicStruct::Builder::get(&local_2c0,(Builder *)&stack0x00000008,(StringPtr)local_2d0);
      local_27a = DynamicValue::Builder::as<short>(&local_2c0);
      kj::_::Debug::log<char_const(&)[79],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x155,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", -12345, reader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [79])
                  "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())"
                 ,&local_278,&local_27a);
      DynamicValue::Builder::~Builder(&local_2c0);
      local_271 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_320,"int32Field");
  DynamicStruct::Builder::get(&local_310,(Builder *)&stack0x00000008,(StringPtr)_auStack_320);
  BVar7 = DynamicValue::Builder::as<int>(&local_310);
  DynamicValue::Builder::~Builder(&local_310);
  if (BVar7 != -0xbc614e) {
    local_321 = kj::_::Debug::shouldLog(ERROR);
    while (local_321 != false) {
      local_328 = -0xbc614e;
      kj::StringPtr::StringPtr((StringPtr *)&local_380,"int32Field");
      DynamicStruct::Builder::get(&local_370,(Builder *)&stack0x00000008,(StringPtr)local_380);
      local_32c = DynamicValue::Builder::as<int>(&local_370);
      kj::_::Debug::log<char_const(&)[82],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x156,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", -12345678, reader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [82])
                  "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
                 ,&local_328,&local_32c);
      DynamicValue::Builder::~Builder(&local_370);
      local_321 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3d0,"int64Field");
  DynamicStruct::Builder::get(&local_3c0,(Builder *)&stack0x00000008,(StringPtr)_auStack_3d0);
  BVar10 = DynamicValue::Builder::as<long>(&local_3c0);
  DynamicValue::Builder::~Builder(&local_3c0);
  if (BVar10 != -0x7048860ddf79) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d1 != false) {
      local_3e0 = -0x7048860ddf79;
      kj::StringPtr::StringPtr((StringPtr *)&local_438,"int64Field");
      DynamicStruct::Builder::get(&local_428,(Builder *)&stack0x00000008,(StringPtr)local_438);
      local_3e8 = DynamicValue::Builder::as<long>(&local_428);
      kj::_::Debug::log<char_const(&)[91],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x157,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [91])
                  "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
                 ,&local_3e0,&local_3e8);
      DynamicValue::Builder::~Builder(&local_428);
      local_3d1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_488,"uInt8Field");
  DynamicStruct::Builder::get(&local_478,(Builder *)&stack0x00000008,(StringPtr)_auStack_488);
  BVar4 = DynamicValue::Builder::as<unsigned_char>(&local_478);
  DynamicValue::Builder::~Builder(&local_478);
  if (BVar4 != 0xea) {
    local_489 = kj::_::Debug::shouldLog(ERROR);
    while (local_489 != false) {
      local_490 = 0xea;
      kj::StringPtr::StringPtr((StringPtr *)&local_4e8,"uInt8Field");
      DynamicStruct::Builder::get(&local_4d8,(Builder *)&stack0x00000008,(StringPtr)local_4e8);
      local_491 = DynamicValue::Builder::as<unsigned_char>(&local_4d8);
      kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [77])
                  "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
                 &local_490,&local_491);
      DynamicValue::Builder::~Builder(&local_4d8);
      local_489 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_538,"uInt16Field");
  DynamicStruct::Builder::get(&local_528,(Builder *)&stack0x00000008,(StringPtr)_auStack_538);
  BVar6 = DynamicValue::Builder::as<unsigned_short>(&local_528);
  DynamicValue::Builder::~Builder(&local_528);
  if (BVar6 != 0xb26e) {
    local_539 = kj::_::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      local_540 = 0xb26e;
      kj::StringPtr::StringPtr((StringPtr *)&local_598,"uInt16Field");
      DynamicStruct::Builder::get(&local_588,(Builder *)&stack0x00000008,(StringPtr)local_598);
      local_542 = DynamicValue::Builder::as<unsigned_short>(&local_588);
      kj::_::Debug::log<char_const(&)[81],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [81])
                  "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,&local_540,&local_542);
      DynamicValue::Builder::~Builder(&local_588);
      local_539 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_5e8,"uInt32Field");
  DynamicStruct::Builder::get(&local_5d8,(Builder *)&stack0x00000008,(StringPtr)_auStack_5e8);
  BVar8 = DynamicValue::Builder::as<unsigned_int>(&local_5d8);
  DynamicValue::Builder::~Builder(&local_5d8);
  if (BVar8 != 0xce0a6a14) {
    local_5e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e9 != false) {
      local_5f0 = 0xce0a6a14;
      kj::StringPtr::StringPtr((StringPtr *)&local_648,"uInt32Field");
      DynamicStruct::Builder::get(&local_638,(Builder *)&stack0x00000008,(StringPtr)local_648);
      local_5f4 = DynamicValue::Builder::as<unsigned_int>(&local_638);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [86])
                  "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,&local_5f0,&local_5f4);
      DynamicValue::Builder::~Builder(&local_638);
      local_5e9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_698,"uInt64Field");
  DynamicStruct::Builder::get(&local_688,(Builder *)&stack0x00000008,(StringPtr)_auStack_698);
  BVar11 = DynamicValue::Builder::as<unsigned_long>(&local_688);
  DynamicValue::Builder::~Builder(&local_688);
  if (BVar11 != 0xab54a98ceb1f0ad2) {
    local_699 = kj::_::Debug::shouldLog(ERROR);
    while (local_699 != false) {
      local_6a8 = 0xab54a98ceb1f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)&local_700,"uInt64Field");
      DynamicStruct::Builder::get(&local_6f0,(Builder *)&stack0x00000008,(StringPtr)local_700);
      local_6b0 = DynamicValue::Builder::as<unsigned_long>(&local_6f0);
      kj::_::Debug::log<char_const(&)[98],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [98])
                  "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,&local_6a8,&local_6b0);
      DynamicValue::Builder::~Builder(&local_6f0);
      local_699 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_750,"float32Field");
  DynamicStruct::Builder::get(&local_740,(Builder *)&stack0x00000008,(StringPtr)_auStack_750);
  BVar12 = DynamicValue::Builder::as<float>(&local_740);
  bVar1 = kj::_::floatAlmostEqual(BVar12,1234.5);
  DynamicValue::Builder::~Builder(&local_740);
  if (!bVar1) {
    local_751 = kj::_::Debug::shouldLog(ERROR);
    while (local_751 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_7a8,"float32Field");
      DynamicStruct::Builder::get(&local_798,(Builder *)&stack0x00000008,(StringPtr)local_7a8);
      local_758 = DynamicValue::Builder::as<float>(&local_798);
      local_7ac = 1234.5;
      kj::_::Debug::log<char_const(&)[101],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", reader.get(\"float32Field\").template as<float>(), 1234.5f"
                 ,(char (*) [101])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
                 ,&local_758,&local_7ac);
      DynamicValue::Builder::~Builder(&local_798);
      local_751 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_800,"float64Field");
  DynamicStruct::Builder::get(&local_7f0,(Builder *)&stack0x00000008,(StringPtr)_auStack_800);
  BVar14 = DynamicValue::Builder::as<double>(&local_7f0);
  bVar1 = kj::_::doubleAlmostEqual(BVar14,-1.23e+47);
  DynamicValue::Builder::~Builder(&local_7f0);
  if (!bVar1) {
    local_801 = kj::_::Debug::shouldLog(ERROR);
    while (local_801 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_860,"float64Field");
      DynamicStruct::Builder::get(&local_850,(Builder *)&stack0x00000008,(StringPtr)local_860);
      local_810 = DynamicValue::Builder::as<double>(&local_850);
      local_868 = -1.23e+47;
      kj::_::Debug::log<char_const(&)[103],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", reader.get(\"float64Field\").template as<double>(), -123e45"
                 ,(char (*) [103])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
                 ,&local_810,&local_868);
      DynamicValue::Builder::~Builder(&local_850);
      local_801 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_8d0,"textField");
  DynamicStruct::Builder::get(&local_8c0,(Builder *)&stack0x00000008,(StringPtr)_auStack_8d0);
  DynamicValue::Builder::as<capnp::Text>(&local_880,&local_8c0);
  bVar1 = capnp::operator==("foo",&local_880);
  DynamicValue::Builder::~Builder(&local_8c0);
  if (!bVar1) {
    local_8d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8d1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_940,"textField");
      DynamicStruct::Builder::get(&local_930,(Builder *)&stack0x00000008,(StringPtr)local_940);
      DynamicValue::Builder::as<capnp::Text>(&local_8f0,&local_930);
      kj::_::Debug::log<char_const(&)[74],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"foo\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
                 (char (*) [4])"foo",&local_8f0);
      DynamicValue::Builder::~Builder(&local_930);
      local_8d1 = false;
    }
  }
  local_950 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  kj::StringPtr::StringPtr((StringPtr *)auStack_9b0,"dataField");
  DynamicStruct::Builder::get(&local_9a0,(Builder *)&stack0x00000008,(StringPtr)_auStack_9b0);
  local_960 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_9a0);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_950,&local_960);
  DynamicValue::Builder::~Builder(&local_9a0);
  if (!bVar1) {
    local_9b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_9b1 != false) {
      local_9c8 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      kj::StringPtr::StringPtr((StringPtr *)&subReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_a18,(Builder *)&stack0x00000008,(StringPtr)stack0xfffffffffffff5d8);
      AVar15 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_a18);
      local_9d8 = AVar15;
      kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_9c8,(Builder *)&local_9d8);
      DynamicValue::Builder::~Builder(&local_a18);
      local_9b1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_aa8,"structField");
  DynamicStruct::Builder::get(&local_a98,(Builder *)&stack0x00000008,(StringPtr)local_aa8);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_a58,&local_a98);
  DynamicValue::Builder::~Builder(&local_a98);
  kj::StringPtr::StringPtr((StringPtr *)auStack_b00,"voidField");
  DynamicStruct::Builder::get(&local_af0,(Builder *)local_a58,(StringPtr)_auStack_b00);
  DynamicValue::Builder::as<capnp::Void>(&local_af0);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Builder::~Builder(&local_af0);
  if (!bVar1) {
    local_b02 = kj::_::Debug::shouldLog(ERROR);
    while (local_b02 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_b58,"voidField");
      DynamicStruct::Builder::get(&local_b48,(Builder *)local_a58,(StringPtr)local_b58);
      DynamicValue::Builder::as<capnp::Void>(&local_b48);
      kj::_::Debug::log<char_const(&)[76],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", VOID, subReader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [76])
                  "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_b03);
      DynamicValue::Builder::~Builder(&local_b48);
      local_b02 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_bb0,"boolField");
  DynamicStruct::Builder::get(&local_ba0,(Builder *)local_a58,(StringPtr)_auStack_bb0);
  BVar2 = DynamicValue::Builder::as<bool>(&local_ba0);
  DynamicValue::Builder::~Builder(&local_ba0);
  if (!BVar2) {
    local_bb1 = kj::_::Debug::shouldLog(ERROR);
    while (local_bb1 != false) {
      local_bb2 = true;
      kj::StringPtr::StringPtr((StringPtr *)&local_c08,"boolField");
      DynamicStruct::Builder::get(&local_bf8,(Builder *)local_a58,(StringPtr)local_c08);
      local_bb3 = DynamicValue::Builder::as<bool>(&local_bf8);
      kj::_::Debug::log<char_const(&)[76],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", true, subReader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [76])
                  "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
                 &local_bb2,&local_bb3);
      DynamicValue::Builder::~Builder(&local_bf8);
      local_bb1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_c58,"int8Field");
  DynamicStruct::Builder::get(&local_c48,(Builder *)local_a58,(StringPtr)_auStack_c58);
  BVar3 = DynamicValue::Builder::as<signed_char>(&local_c48);
  DynamicValue::Builder::~Builder(&local_c48);
  if (BVar3 != -0xc) {
    local_c59 = kj::_::Debug::shouldLog(ERROR);
    while (local_c59 != false) {
      local_c60 = -0xc;
      kj::StringPtr::StringPtr((StringPtr *)&local_cb8,"int8Field");
      DynamicStruct::Builder::get(&local_ca8,(Builder *)local_a58,(StringPtr)local_cb8);
      local_c61 = DynamicValue::Builder::as<signed_char>(&local_ca8);
      kj::_::Debug::log<char_const(&)[77],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", -12, subReader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [77])
                  "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
                 &local_c60,&local_c61);
      DynamicValue::Builder::~Builder(&local_ca8);
      local_c59 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_d08,"int16Field");
  DynamicStruct::Builder::get(&local_cf8,(Builder *)local_a58,(StringPtr)_auStack_d08);
  BVar5 = DynamicValue::Builder::as<short>(&local_cf8);
  DynamicValue::Builder::~Builder(&local_cf8);
  if (BVar5 != 0xd80) {
    local_d09 = kj::_::Debug::shouldLog(ERROR);
    while (local_d09 != false) {
      local_d10 = 0xd80;
      kj::StringPtr::StringPtr((StringPtr *)&local_d68,"int16Field");
      DynamicStruct::Builder::get(&local_d58,(Builder *)local_a58,(StringPtr)local_d68);
      local_d12 = DynamicValue::Builder::as<short>(&local_d58);
      kj::_::Debug::log<char_const(&)[80],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 3456, subReader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [80])
                  "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())"
                 ,&local_d10,&local_d12);
      DynamicValue::Builder::~Builder(&local_d58);
      local_d09 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_db8,"int32Field");
  DynamicStruct::Builder::get(&local_da8,(Builder *)local_a58,(StringPtr)_auStack_db8);
  BVar7 = DynamicValue::Builder::as<int>(&local_da8);
  DynamicValue::Builder::~Builder(&local_da8);
  if (BVar7 != -0x4b3eff2) {
    local_db9 = kj::_::Debug::shouldLog(ERROR);
    while (local_db9 != false) {
      local_dc0 = -0x4b3eff2;
      kj::StringPtr::StringPtr((StringPtr *)&local_e18,"int32Field");
      DynamicStruct::Builder::get(&local_e08,(Builder *)local_a58,(StringPtr)local_e18);
      local_dc4 = DynamicValue::Builder::as<int>(&local_e08);
      kj::_::Debug::log<char_const(&)[85],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [85])
                  "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
                 ,&local_dc0,&local_dc4);
      DynamicValue::Builder::~Builder(&local_e08);
      local_db9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_e68,"int64Field");
  DynamicStruct::Builder::get(&local_e58,(Builder *)local_a58,(StringPtr)_auStack_e68);
  BVar10 = DynamicValue::Builder::as<long>(&local_e58);
  DynamicValue::Builder::~Builder(&local_e58);
  if (BVar10 != 0x33a638e8734e) {
    local_e69 = kj::_::Debug::shouldLog(ERROR);
    while (local_e69 != false) {
      local_e78 = 0x33a638e8734e;
      kj::StringPtr::StringPtr((StringPtr *)&local_ed0,"int64Field");
      DynamicStruct::Builder::get(&local_ec0,(Builder *)local_a58,(StringPtr)local_ed0);
      local_e80 = DynamicValue::Builder::as<long>(&local_ec0);
      kj::_::Debug::log<char_const(&)[92],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x167,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [92])
                  "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
                 ,&local_e78,&local_e80);
      DynamicValue::Builder::~Builder(&local_ec0);
      local_e69 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_f20,"uInt8Field");
  DynamicStruct::Builder::get(&local_f10,(Builder *)local_a58,(StringPtr)_auStack_f20);
  BVar4 = DynamicValue::Builder::as<unsigned_char>(&local_f10);
  DynamicValue::Builder::~Builder(&local_f10);
  if (BVar4 != 'Z') {
    local_f21 = kj::_::Debug::shouldLog(ERROR);
    while (local_f21 != false) {
      local_f28 = 0x5a;
      kj::StringPtr::StringPtr((StringPtr *)&local_f80,"uInt8Field");
      DynamicStruct::Builder::get(&local_f70,(Builder *)local_a58,(StringPtr)local_f80);
      local_f29 = DynamicValue::Builder::as<unsigned_char>(&local_f70);
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x168,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [79])
                  "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())"
                 ,&local_f28,&local_f29);
      DynamicValue::Builder::~Builder(&local_f70);
      local_f21 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_fd0,"uInt16Field");
  DynamicStruct::Builder::get(&local_fc0,(Builder *)local_a58,(StringPtr)_auStack_fd0);
  BVar6 = DynamicValue::Builder::as<unsigned_short>(&local_fc0);
  DynamicValue::Builder::~Builder(&local_fc0);
  if (BVar6 != 0x4d2) {
    local_fd1 = kj::_::Debug::shouldLog(ERROR);
    while (local_fd1 != false) {
      local_fd8 = 0x4d2;
      kj::StringPtr::StringPtr((StringPtr *)&local_1030,"uInt16Field");
      DynamicStruct::Builder::get(&local_1020,(Builder *)local_a58,(StringPtr)local_1030);
      local_fda = DynamicValue::Builder::as<unsigned_short>(&local_1020);
      kj::_::Debug::log<char_const(&)[83],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x169,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [83])
                  "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,&local_fd8,&local_fda);
      DynamicValue::Builder::~Builder(&local_1020);
      local_fd1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1080,"uInt32Field");
  DynamicStruct::Builder::get(&local_1070,(Builder *)local_a58,(StringPtr)_auStack_1080);
  BVar8 = DynamicValue::Builder::as<unsigned_int>(&local_1070);
  DynamicValue::Builder::~Builder(&local_1070);
  if (BVar8 != 0x3628814) {
    local_1081 = kj::_::Debug::shouldLog(ERROR);
    while (local_1081 != false) {
      local_1088 = 0x3628814;
      kj::StringPtr::StringPtr((StringPtr *)&local_10e0,"uInt32Field");
      DynamicStruct::Builder::get(&local_10d0,(Builder *)local_a58,(StringPtr)local_10e0);
      local_108c = DynamicValue::Builder::as<unsigned_int>(&local_10d0);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16a,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [87])
                  "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,&local_1088,&local_108c);
      DynamicValue::Builder::~Builder(&local_10d0);
      local_1081 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1130,"uInt64Field");
  DynamicStruct::Builder::get(&local_1120,(Builder *)local_a58,(StringPtr)_auStack_1130);
  BVar11 = DynamicValue::Builder::as<unsigned_long>(&local_1120);
  DynamicValue::Builder::~Builder(&local_1120);
  if (BVar11 != 0x4cc1921126f0ad2) {
    local_1131 = kj::_::Debug::shouldLog(ERROR);
    while (local_1131 != false) {
      local_1140 = 0x4cc1921126f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)&local_1198,"uInt64Field");
      DynamicStruct::Builder::get(&local_1188,(Builder *)local_a58,(StringPtr)local_1198);
      local_1148 = DynamicValue::Builder::as<unsigned_long>(&local_1188);
      kj::_::Debug::log<char_const(&)[99],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16b,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [99])
                  "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,&local_1140,&local_1148);
      DynamicValue::Builder::~Builder(&local_1188);
      local_1131 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_11e8,"float32Field");
  DynamicStruct::Builder::get(&local_11d8,(Builder *)local_a58,(StringPtr)_auStack_11e8);
  BVar12 = DynamicValue::Builder::as<float>(&local_11d8);
  bVar1 = kj::_::floatAlmostEqual(BVar12,-1.25e-10);
  DynamicValue::Builder::~Builder(&local_11d8);
  if (!bVar1) {
    local_11e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11e9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1240,"float32Field");
      DynamicStruct::Builder::get(&local_1230,(Builder *)local_a58,(StringPtr)local_1240);
      local_11f0 = DynamicValue::Builder::as<float>(&local_1230);
      local_1244 = -1.25e-10;
      kj::_::Debug::log<char_const(&)[107],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
                 ,(char (*) [107])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
                 ,&local_11f0,&local_1244);
      DynamicValue::Builder::~Builder(&local_1230);
      local_11e9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1298,"float64Field");
  DynamicStruct::Builder::get(&local_1288,(Builder *)local_a58,(StringPtr)_auStack_1298);
  BVar14 = DynamicValue::Builder::as<double>(&local_1288);
  bVar1 = kj::_::doubleAlmostEqual(BVar14,345.0);
  DynamicValue::Builder::~Builder(&local_1288);
  if (!bVar1) {
    local_1299 = kj::_::Debug::shouldLog(ERROR);
    while (local_1299 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_12f8,"float64Field");
      DynamicStruct::Builder::get(&local_12e8,(Builder *)local_a58,(StringPtr)local_12f8);
      local_12a8 = DynamicValue::Builder::as<double>(&local_12e8);
      local_12fc = 0x159;
      kj::_::Debug::log<char_const(&)[102],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", subReader.get(\"float64Field\").template as<double>(), 345"
                 ,(char (*) [102])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
                 ,&local_12a8,&local_12fc);
      DynamicValue::Builder::~Builder(&local_12e8);
      local_1299 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1368,"textField");
  DynamicStruct::Builder::get(&local_1358,(Builder *)local_a58,(StringPtr)_auStack_1368);
  DynamicValue::Builder::as<capnp::Text>(&local_1318,&local_1358);
  bVar1 = capnp::operator==("baz",&local_1318);
  DynamicValue::Builder::~Builder(&local_1358);
  if (!bVar1) {
    local_1369 = kj::_::Debug::shouldLog(ERROR);
    while (local_1369 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_13d8,"textField");
      DynamicStruct::Builder::get(&local_13c8,(Builder *)local_a58,(StringPtr)local_13d8);
      DynamicValue::Builder::as<capnp::Text>(&local_1388,&local_13c8);
      kj::_::Debug::log<char_const(&)[77],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"baz\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [4])0x4bdece,&local_1388);
      DynamicValue::Builder::~Builder(&local_13c8);
      local_1369 = false;
    }
  }
  local_13e8 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  kj::StringPtr::StringPtr((StringPtr *)auStack_1448,"dataField");
  DynamicStruct::Builder::get(&local_1438,(Builder *)local_a58,(StringPtr)_auStack_1448);
  local_13f8 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_1438);
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_13e8,&local_13f8);
  DynamicValue::Builder::~Builder(&local_1438);
  if (!bVar1) {
    local_1449 = kj::_::Debug::shouldLog(ERROR);
    while (local_1449 != false) {
      local_1460 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      kj::StringPtr::StringPtr((StringPtr *)&subSubReader.builder.dataSize,"dataField");
      DynamicStruct::Builder::get
                (&local_14b0,(Builder *)local_a58,(StringPtr)stack0xffffffffffffeb40);
      AVar15 = (ArrayPtr<unsigned_char>)DynamicValue::Builder::as<capnp::Data>(&local_14b0);
      local_1470 = AVar15;
      kj::_::Debug::log<char_const(&)[83],capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [83])
                  "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_1460,(Builder *)&local_1470);
      DynamicValue::Builder::~Builder(&local_14b0);
      local_1449 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1540,"structField");
  DynamicStruct::Builder::get(&local_1530,(Builder *)local_a58,(StringPtr)local_1540);
  DynamicValue::Builder::as<capnp::DynamicStruct>
            ((BuilderFor<capnp::DynamicStruct> *)local_14f0,&local_1530);
  DynamicValue::Builder::~Builder(&local_1530);
  kj::StringPtr::StringPtr((StringPtr *)auStack_15a8,"textField");
  DynamicStruct::Builder::get(&local_1598,(Builder *)local_14f0,(StringPtr)_auStack_15a8);
  DynamicValue::Builder::as<capnp::Text>(&local_1558,&local_1598);
  bVar1 = capnp::operator==("nested",&local_1558);
  DynamicValue::Builder::~Builder(&local_1598);
  if (!bVar1) {
    local_15a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_15a9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1618,"textField");
      DynamicStruct::Builder::get(&local_1608,(Builder *)local_14f0,(StringPtr)local_1618);
      DynamicValue::Builder::as<capnp::Text>(&local_15c8,&local_1608);
      kj::_::Debug::log<char_const(&)[83],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"nested\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [83])
                  "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [7])0x4cc19c,&local_15c8);
      DynamicValue::Builder::~Builder(&local_1608);
      local_15a9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_16f0,"structField");
  DynamicStruct::Builder::get(&local_16e0,(Builder *)local_14f0,(StringPtr)local_16f0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_16a0,&local_16e0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1700,"textField");
  DynamicStruct::Builder::get(&local_1670,&local_16a0,(StringPtr)_auStack_1700);
  DynamicValue::Builder::as<capnp::Text>(&local_1630,&local_1670);
  bVar1 = capnp::operator==("really nested",&local_1630);
  DynamicValue::Builder::~Builder(&local_1670);
  DynamicValue::Builder::~Builder(&local_16e0);
  if (!bVar1) {
    local_1701 = kj::_::Debug::shouldLog(ERROR);
    while (local_1701 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_17e0,"structField");
      DynamicStruct::Builder::get(&local_17d0,(Builder *)local_14f0,(StringPtr)local_17e0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1790,&local_17d0);
      kj::StringPtr::StringPtr((StringPtr *)&local_17f0,"textField");
      DynamicStruct::Builder::get(&local_1760,&local_1790,(StringPtr)local_17f0);
      DynamicValue::Builder::as<capnp::Text>(&local_1720,&local_1760);
      kj::_::Debug::log<char_const(&)[139],char_const(&)[14],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x174,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
                 ,(char (*) [139])
                  "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
                 ,(char (*) [14])"really nested",&local_1720);
      DynamicValue::Builder::~Builder(&local_1760);
      DynamicValue::Builder::~Builder(&local_17d0);
      local_1701 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1860,"enumField");
  DynamicStruct::Builder::get(&local_1850,(Builder *)local_a58,(StringPtr)local_1860);
  BVar16 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_1850);
  e._8_8_ = BVar16._8_8_;
  SStack_1870.raw = (RawBrandedSchema *)BVar16.schema.super_Schema.raw;
  local_1868 = BVar16.value;
  local_1808 = CONCAT22(local_1808._2_2_,local_1868);
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = local_1808;
  local_1810.raw = SStack_1870.raw;
  local_1800 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)SStack_1870.raw,e);
  bVar1 = kj::operator==("baz",(StringPtr *)&local_1800);
  DynamicValue::Builder::~Builder(&local_1850);
  if (!bVar1) {
    local_1871 = kj::_::Debug::shouldLog(ERROR);
    while (local_1871 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_18e8,"enumField");
      DynamicStruct::Builder::get(&local_18d8,(Builder *)local_a58,(StringPtr)local_18e8);
      BVar16 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_18d8);
      e_00._8_8_ = BVar16._8_8_;
      local_18f8.raw = (RawBrandedSchema *)BVar16.schema.super_Schema.raw;
      local_18f0 = BVar16.value;
      local_1890 = CONCAT22(local_1890._2_2_,local_18f0);
      e_00.schema.super_Schema.raw._4_4_ = 0;
      e_00.schema.super_Schema.raw._0_4_ = local_1890;
      local_1898.raw = local_18f8.raw;
      AVar17 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)local_18f8.raw,e_00)
      ;
      local_1888 = AVar17;
      kj::_::Debug::log<char_const(&)[90],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [90])
                  "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [4])0x4bdece,(Reader *)&local_1888);
      DynamicValue::Builder::~Builder(&local_18d8);
      local_1871 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_1948,"voidList");
  name_23.content.size_ = local_1948.content.size_;
  name_23.content.ptr = local_1948.content.ptr;
  DynamicStruct::Builder::get(&local_1938,(Builder *)local_a58,name_23);
  local_195b._3_8_ = local_195b;
  local_195b._11_8_ = 3;
  expected._M_len = local_1948.content.size_;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Builder>
            ((_ *)&local_1938,(Builder *)local_195b._3_8_,expected);
  DynamicValue::Builder::~Builder(&local_1938);
  kj::StringPtr::StringPtr(&local_19b0,"boolList");
  name_22.content.size_ = local_19b0.content.size_;
  name_22.content.ptr = local_19b0.content.ptr;
  DynamicStruct::Builder::get(&local_19a0,(Builder *)local_a58,name_22);
  local_19c5[0] = UNKNOWN;
  local_19c5[1] = 1;
  local_19c5[2] = UNKNOWN >> 0x10;
  local_19c5[3] = 1;
  local_19c5[4] = 1;
  local_19c5._5_8_ = local_19c5;
  local_19c5._13_8_ = 5;
  expected_00._M_len = local_19b0.content.size_;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Builder>
            ((_ *)&local_19a0,(Builder *)local_19c5._5_8_,expected_00);
  DynamicValue::Builder::~Builder(&local_19a0);
  kj::StringPtr::StringPtr(&local_1a18,"int8List");
  name_21.content.size_ = local_1a18.content.size_;
  name_21.content.ptr = local_1a18.content.ptr;
  DynamicStruct::Builder::get(&local_1a08,(Builder *)local_a58,name_21);
  local_1a2c[0] = ANY_POINTER;
  local_1a2c[1] = 0xde;
  local_1a2c[2] = 0x80;
  local_1a2c[3] = 0x7f;
  local_1a2c._4_8_ = local_1a2c;
  local_1a2c._12_8_ = 4;
  expected_01._M_len = local_1a18.content.size_;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_1a08,(Builder *)local_1a2c._4_8_,expected_01);
  DynamicValue::Builder::~Builder(&local_1a08);
  kj::StringPtr::StringPtr((StringPtr *)(local_1a98 + 0x18),"int16List");
  name_20.content.size_ = local_1a98._32_8_;
  name_20.content.ptr = (char *)local_1a98._24_8_;
  DynamicStruct::Builder::get(&local_1a70,(Builder *)local_a58,name_20);
  local_1a98._0_2_ = 0x4d2;
  local_1a98._2_2_ = 0xe9d2;
  local_1a98._4_2_ = 0x8000;
  local_1a98._6_2_ = 0x7fff;
  local_1a98._8_8_ = local_1a98;
  local_1a98._16_8_ = 4;
  expected_02._M_len = local_1a98._32_8_;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Builder>
            ((_ *)&local_1a70,(Builder *)local_1a98._8_8_,expected_02);
  DynamicValue::Builder::~Builder(&local_1a70);
  kj::StringPtr::StringPtr((StringPtr *)(local_1b08 + 0x20),"int32List");
  name_19.content.size_ = local_1b08._40_8_;
  name_19.content.ptr = (char *)local_1b08._32_8_;
  DynamicStruct::Builder::get(&local_1ad8,(Builder *)local_a58,name_19);
  local_1b08._0_4_ = 0xbc614e;
  local_1b08._4_4_ = 0xfaa0d340;
  local_1b08._8_4_ = 0x80000000;
  local_1b08._12_4_ = 0x7fffffff;
  local_1b08._16_8_ = local_1b08;
  local_1b08._24_8_ = 4;
  expected_03._M_len = local_1b08._40_8_;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Builder>
            ((_ *)&local_1ad8,(Builder *)local_1b08._16_8_,expected_03);
  DynamicValue::Builder::~Builder(&local_1ad8);
  kj::StringPtr::StringPtr((StringPtr *)(local_1b88 + 0x30),"int64List");
  name_18.content.size_ = local_1b88._56_8_;
  name_18.content.ptr = (char *)local_1b88._48_8_;
  DynamicStruct::Builder::get(&local_1b48,(Builder *)local_a58,name_18);
  local_1b88._16_8_ = 0x8000000000000000;
  local_1b88._24_8_ = 0x7fffffffffffffff;
  local_1b88._0_8_ = 0x7048860ddf79;
  local_1b88._8_8_ = (uchar *)0xfffd968afd13752e;
  local_1b88._32_8_ = local_1b88;
  local_1b88._40_8_ = (byte *)0x4;
  expected_04._M_len = local_1b88._56_8_;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Builder>
            ((_ *)&local_1b48,(Builder *)local_1b88._32_8_,expected_04);
  DynamicValue::Builder::~Builder(&local_1b48);
  kj::StringPtr::StringPtr(&local_1bd8,"uInt8List");
  name_17.content.size_ = local_1bd8.content.size_;
  name_17.content.ptr = local_1bd8.content.ptr;
  DynamicStruct::Builder::get(&local_1bc8,(Builder *)local_a58,name_17);
  local_1bec[0] = ANY_POINTER;
  local_1bec[1] = 0x22;
  local_1bec[2] = UNKNOWN >> 0x10;
  local_1bec[3] = 0xff;
  local_1bec._4_8_ = local_1bec;
  local_1bec._12_8_ = 4;
  expected_05._M_len = local_1bd8.content.size_;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_1bc8,(Builder *)local_1bec._4_8_,expected_05);
  DynamicValue::Builder::~Builder(&local_1bc8);
  kj::StringPtr::StringPtr((StringPtr *)(local_1c58 + 0x18),"uInt16List");
  name_16.content.size_ = local_1c58._32_8_;
  name_16.content.ptr = (char *)local_1c58._24_8_;
  DynamicStruct::Builder::get(&local_1c30,(Builder *)local_a58,name_16);
  local_1c58._0_2_ = 0x4d2;
  local_1c58._2_2_ = 0x162e;
  local_1c58._4_2_ = 0;
  local_1c58._6_2_ = 0xffff;
  local_1c58._8_8_ = local_1c58;
  local_1c58._16_8_ = 4;
  expected_06._M_len = local_1c58._32_8_;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_1c30,(Builder *)local_1c58._8_8_,expected_06);
  DynamicValue::Builder::~Builder(&local_1c30);
  kj::StringPtr::StringPtr((StringPtr *)(local_1cc8 + 0x20),"uInt32List");
  name_15.content.size_ = local_1cc8._40_8_;
  name_15.content.ptr = (char *)local_1cc8._32_8_;
  DynamicStruct::Builder::get(&local_1c98,(Builder *)local_a58,name_15);
  local_1cc8._0_4_ = 0xbc614e;
  local_1cc8._4_4_ = 0x55f2cc0;
  local_1cc8._8_4_ = 0;
  local_1cc8._12_4_ = 0xffffffff;
  local_1cc8._16_8_ = local_1cc8;
  local_1cc8._24_8_ = 4;
  expected_07._M_len = local_1cc8._40_8_;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_1c98,(Builder *)local_1cc8._16_8_,expected_07);
  DynamicValue::Builder::~Builder(&local_1c98);
  kj::StringPtr::StringPtr((StringPtr *)(local_1d48 + 0x30),"uInt64List");
  name_14.content.size_ = local_1d48._56_8_;
  name_14.content.ptr = (char *)local_1d48._48_8_;
  DynamicStruct::Builder::get(&local_1d08,(Builder *)local_a58,name_14);
  local_1d48._16_8_ = (char *)0x0;
  local_1d48._24_8_ = 0xffffffffffffffff;
  local_1d48._0_8_ = 0x7048860ddf79;
  local_1d48._8_8_ = 3.35421776919204e-309;
  local_1d48._32_8_ = local_1d48;
  local_1d48._40_8_ = (byte *)0x4;
  expected_08._M_len = local_1d48._56_8_;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_1d08,(Builder *)local_1d48._32_8_,expected_08);
  DynamicValue::Builder::~Builder(&local_1d08);
  kj::StringPtr::StringPtr((StringPtr *)(local_1dc8 + 0x30),"float32List");
  name_13.content.size_ = local_1dc8._56_8_;
  name_13.content.ptr = (char *)local_1dc8._48_8_;
  DynamicStruct::Builder::get(&local_1d88,(Builder *)local_a58,name_13);
  local_1dc8._16_8_ = (char *)0x82081cea02081cea;
  local_1dc8._0_8_ = 0x4996b43800000000;
  local_1dc8._8_8_ = (uchar *)0xfcf0bdc27cf0bdc2;
  local_1dc8._32_8_ = local_1dc8;
  local_1dc8._40_8_ = (byte *)0x6;
  expected_09._M_len = local_1dc8._56_8_;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Builder>
            ((_ *)&local_1d88,(Builder *)local_1dc8._32_8_,expected_09);
  DynamicValue::Builder::~Builder(&local_1d88);
  kj::StringPtr::StringPtr(&local_1e18,"float64List");
  name_12.content.size_ = local_1e18.content.size_;
  name_12.content.ptr = local_1e18.content.ptr;
  DynamicStruct::Builder::get(&local_1e08,(Builder *)local_a58,name_12);
  local_1e58.field_1.listValue.builder.capTable = (CapTableBuilder *)0x66789e3750f791;
  local_1e58.field_1.listValue.builder.ptr = (byte *)0x8066789e3750f791;
  local_1e58.field_1.textValue.content.ptr = (char *)0x7f76c8e5ca239029;
  local_1e58.field_1.listValue.builder.segment = (SegmentBuilder *)0xff76c8e5ca239029;
  local_1e58.type = UNKNOWN;
  local_1e58._4_4_ = 0;
  local_1e58.field_1.dataValue.super_ArrayPtr<unsigned_char>.ptr = (uchar *)0x42dc12218377de40;
  local_1e58.field_1._40_8_ = &local_1e58;
  local_1e58.field_1._48_8_ = 6;
  expected_10._M_len = local_1e18.content.size_;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Builder>
            ((_ *)&local_1e08,(Builder *)local_1e58.field_1._40_8_,expected_10);
  DynamicValue::Builder::~Builder(&local_1e08);
  kj::StringPtr::StringPtr(&local_1ea8,"textList");
  name_11.content.size_ = local_1ea8.content.size_;
  name_11.content.ptr = local_1ea8.content.ptr;
  DynamicStruct::Builder::get(&local_1e98,(Builder *)local_a58,name_11);
  Text::Reader::Reader((Reader *)local_1ee8,"quux");
  Text::Reader::Reader((Reader *)(local_1ee8 + 0x10),"corge");
  Text::Reader::Reader(local_1ec8,"grault");
  local_1ec8[1].super_StringPtr.content.ptr = local_1ee8;
  local_1ec8[1].super_StringPtr.content.size_ = 3;
  expected_11._M_len = local_1ea8.content.size_;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_1e98,(Builder *)local_1ec8[1].super_StringPtr.content.ptr,expected_11);
  DynamicValue::Builder::~Builder(&local_1e98);
  kj::StringPtr::StringPtr((StringPtr *)&local_1f38,"dataList");
  DynamicStruct::Builder::get(&local_1f28,(Builder *)local_a58,(StringPtr)local_1f38);
  RVar18 = _::data("garply");
  listReader.builder._32_8_ = RVar18.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("waldo");
  RVar18 = _::data("fred");
  expected_12._M_len = RVar18.super_ArrayPtr<const_unsigned_char>.size_;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_1f28,(Builder *)&listReader.builder.structDataSize,expected_12);
  DynamicValue::Builder::~Builder(&local_1f28);
  kj::StringPtr::StringPtr((StringPtr *)&f,"structList");
  DynamicStruct::Builder::get(&local_1ff0,(Builder *)local_a58,(StringPtr)_f);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_1fb0,&local_1ff0);
  DynamicValue::Builder::~Builder(&local_1ff0);
  uVar9 = DynamicList::Builder::size((Builder *)local_1fb0);
  if (uVar9 != 3) {
    local_200c = 3;
    local_2010 = DynamicList::Builder::size((Builder *)local_1fb0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2008,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x189,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_200c,
               &local_2010);
    kj::_::Debug::Fault::fatal(&local_2008);
  }
  DynamicList::Builder::operator[](&local_20d8,(Builder *)local_1fb0,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2098,&local_20d8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_20e8,"textField");
  DynamicStruct::Builder::get(&local_2068,&local_2098,(StringPtr)_auStack_20e8);
  DynamicValue::Builder::as<capnp::Text>(&local_2028,&local_2068);
  bVar1 = capnp::operator==("x structlist 1",&local_2028);
  DynamicValue::Builder::~Builder(&local_2068);
  DynamicValue::Builder::~Builder(&local_20d8);
  if (!bVar1) {
    local_20e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_20e9 != false) {
      DynamicList::Builder::operator[](&local_21b8,(Builder *)local_1fb0,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2178,&local_21b8);
      kj::StringPtr::StringPtr((StringPtr *)&local_21c8,"textField");
      DynamicStruct::Builder::get(&local_2148,&local_2178,(StringPtr)local_21c8);
      DynamicValue::Builder::as<capnp::Text>(&local_2108,&local_2148);
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18a,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 1",&local_2108);
      DynamicValue::Builder::~Builder(&local_2148);
      DynamicValue::Builder::~Builder(&local_21b8);
      local_20e9 = false;
    }
  }
  DynamicList::Builder::operator[](&local_2290,(Builder *)local_1fb0,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2250,&local_2290);
  kj::StringPtr::StringPtr((StringPtr *)auStack_22a0,"textField");
  DynamicStruct::Builder::get(&local_2220,&local_2250,(StringPtr)_auStack_22a0);
  DynamicValue::Builder::as<capnp::Text>(&local_21e0,&local_2220);
  bVar1 = capnp::operator==("x structlist 2",&local_21e0);
  DynamicValue::Builder::~Builder(&local_2220);
  DynamicValue::Builder::~Builder(&local_2290);
  if (!bVar1) {
    local_22a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_22a1 != false) {
      DynamicList::Builder::operator[](&local_2370,(Builder *)local_1fb0,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2330,&local_2370);
      kj::StringPtr::StringPtr((StringPtr *)&local_2380,"textField");
      DynamicStruct::Builder::get(&local_2300,&local_2330,(StringPtr)local_2380);
      DynamicValue::Builder::as<capnp::Text>(&local_22c0,&local_2300);
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18b,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 2",&local_22c0);
      DynamicValue::Builder::~Builder(&local_2300);
      DynamicValue::Builder::~Builder(&local_2370);
      local_22a1 = false;
    }
  }
  DynamicList::Builder::operator[](&local_2448,(Builder *)local_1fb0,2);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_2408,&local_2448);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2458,"textField");
  DynamicStruct::Builder::get(&local_23d8,&local_2408,(StringPtr)_auStack_2458);
  DynamicValue::Builder::as<capnp::Text>(&local_2398,&local_23d8);
  bVar1 = capnp::operator==("x structlist 3",&local_2398);
  DynamicValue::Builder::~Builder(&local_23d8);
  DynamicValue::Builder::~Builder(&local_2448);
  if (!bVar1) {
    local_2459 = kj::_::Debug::shouldLog(ERROR);
    while (local_2459 != false) {
      DynamicList::Builder::operator[](&local_2528,(Builder *)local_1fb0,2);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_24e8,&local_2528);
      kj::StringPtr::StringPtr((StringPtr *)&local_2538,"textField");
      DynamicStruct::Builder::get(&local_24b8,&local_24e8,(StringPtr)local_2538);
      DynamicValue::Builder::as<capnp::Text>(&local_2478,&local_24b8);
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18c,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 3",&local_2478);
      DynamicValue::Builder::~Builder(&local_24b8);
      DynamicValue::Builder::~Builder(&local_2528);
      local_2459 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2588,"enumList");
  name_10.content.size_ = local_2588.content.size_;
  name_10.content.ptr = local_2588.content.ptr;
  DynamicStruct::Builder::get(&local_2578,(Builder *)local_a58,name_10);
  auStack_25b0._8_8_ = "grault";
  local_25b8 = "qux";
  auStack_25b0._0_8_ = (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31
  ;
  auStack_25b0._24_8_ = &local_25b8;
  auStack_25b0._32_8_ = (byte *)0x3;
  expected_13._M_len = local_2588.content.size_;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Builder>
            ((anon_unknown_130 *)&local_2578,(Builder *)auStack_25b0._24_8_,expected_13);
  DynamicValue::Builder::~Builder(&local_2578);
  kj::StringPtr::StringPtr((StringPtr *)&local_2628,"enumField");
  DynamicStruct::Builder::get(&local_2618,(Builder *)&stack0x00000008,(StringPtr)local_2628);
  BVar16 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_2618);
  e_01._8_8_ = BVar16._8_8_;
  SStack_2638.raw = (RawBrandedSchema *)BVar16.schema.super_Schema.raw;
  local_2630 = BVar16.value;
  local_25d0 = CONCAT22(local_25d0._2_2_,local_2630);
  e_01.schema.super_Schema.raw._4_4_ = 0;
  e_01.schema.super_Schema.raw._0_4_ = local_25d0;
  local_25d8.raw = SStack_2638.raw;
  local_25c8 = (ArrayPtr<const_char>)
               anon_unknown_130::name((anon_unknown_130 *)SStack_2638.raw,e_01);
  bVar1 = kj::operator==("corge",(StringPtr *)&local_25c8);
  DynamicValue::Builder::~Builder(&local_2618);
  if (!bVar1) {
    local_2639 = kj::_::Debug::shouldLog(ERROR);
    while (local_2639 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_26b0,"enumField");
      DynamicStruct::Builder::get(&local_26a0,(Builder *)&stack0x00000008,(StringPtr)local_26b0);
      BVar16 = DynamicValue::Builder::as<capnp::DynamicEnum>(&local_26a0);
      e_02._8_8_ = BVar16._8_8_;
      local_26c0.raw = (RawBrandedSchema *)BVar16.schema.super_Schema.raw;
      local_26b8 = BVar16.value;
      local_2658 = CONCAT22(local_2658._2_2_,local_26b8);
      e_02.schema.super_Schema.raw._4_4_ = 0;
      e_02.schema.super_Schema.raw._0_4_ = local_2658;
      local_2660.raw = local_26c0.raw;
      AVar17 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)local_26c0.raw,e_02)
      ;
      local_2650 = AVar17;
      kj::_::Debug::log<char_const(&)[89],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [89])
                  "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [6])"corge",(Reader *)&local_2650);
      DynamicValue::Builder::~Builder(&local_26a0);
      local_2639 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2748,"voidList");
  DynamicStruct::Builder::get(&local_2738,(Builder *)&stack0x00000008,(StringPtr)_auStack_2748);
  DynamicValue::Builder::as<capnp::DynamicList>(&local_26f8,&local_2738);
  uVar9 = DynamicList::Builder::size(&local_26f8);
  DynamicValue::Builder::~Builder(&local_2738);
  if (uVar9 != 6) {
    local_2749 = kj::_::Debug::shouldLog(ERROR);
    while (local_2749 != false) {
      local_2750 = 6;
      kj::StringPtr::StringPtr((StringPtr *)&local_27e0,"voidList");
      DynamicStruct::Builder::get(&local_27d0,(Builder *)&stack0x00000008,(StringPtr)local_27e0);
      DynamicValue::Builder::as<capnp::DynamicList>(&local_2790,&local_27d0);
      local_2754 = DynamicList::Builder::size(&local_2790);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,&local_2750,&local_2754);
      DynamicValue::Builder::~Builder(&local_27d0);
      local_2749 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2830,"boolList");
  name_09.content.size_ = local_2830.content.size_;
  name_09.content.ptr = local_2830.content.ptr;
  DynamicStruct::Builder::get(&local_2820,(Builder *)&stack0x00000008,name_09);
  local_2844[0] = VOID;
  local_2844[1] = UNKNOWN >> 8;
  local_2844[2] = UNKNOWN >> 0x10;
  local_2844[3] = 1;
  local_2844._4_8_ = local_2844;
  local_2844._12_8_ = 4;
  expected_14._M_len = local_2830.content.size_;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Builder>
            ((_ *)&local_2820,(Builder *)local_2844._4_8_,expected_14);
  DynamicValue::Builder::~Builder(&local_2820);
  kj::StringPtr::StringPtr(&local_2898,"int8List");
  name_08.content.size_ = local_2898.content.size_;
  name_08.content.ptr = local_2898.content.ptr;
  DynamicStruct::Builder::get(&local_2888,(Builder *)&stack0x00000008,name_08);
  local_28aa[0] = 0x6f;
  local_28aa[1] = 0x91;
  local_28aa._2_8_ = local_28aa;
  local_28aa._10_8_ = 2;
  expected_15._M_len = local_2898.content.size_;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Builder>
            ((_ *)&local_2888,(Builder *)local_28aa._2_8_,expected_15);
  DynamicValue::Builder::~Builder(&local_2888);
  kj::StringPtr::StringPtr(&local_2900,"int16List");
  name_07.content.size_ = local_2900.content.size_;
  name_07.content.ptr = local_2900.content.ptr;
  DynamicStruct::Builder::get(&local_28f0,(Builder *)&stack0x00000008,name_07);
  local_2914._0_2_ = 0x2b67;
  local_2914._2_2_ = 0xd499;
  local_2914._4_8_ = local_2914;
  local_2914._12_8_ = 2;
  expected_16._M_len = local_2900.content.size_;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Builder>
            ((_ *)&local_28f0,(Builder *)local_2914._4_8_,expected_16);
  DynamicValue::Builder::~Builder(&local_28f0);
  kj::StringPtr::StringPtr((StringPtr *)(local_2980 + 0x18),"int32List");
  name_06.content.size_ = local_2980._32_8_;
  name_06.content.ptr = (char *)local_2980._24_8_;
  DynamicStruct::Builder::get(&local_2958,(Builder *)&stack0x00000008,name_06);
  local_2980._0_4_ = 0x69f6bc7;
  local_2980._4_4_ = 0xf9609439;
  local_2980._8_8_ = local_2980;
  local_2980._16_8_ = 2;
  expected_17._M_len = local_2980._32_8_;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Builder>
            ((_ *)&local_2958,(Builder *)local_2980._8_8_,expected_17);
  DynamicValue::Builder::~Builder(&local_2958);
  kj::StringPtr::StringPtr((StringPtr *)(local_29f0 + 0x20),"int64List");
  name_05.content.size_ = local_29f0._40_8_;
  name_05.content.ptr = (char *)local_29f0._32_8_;
  DynamicStruct::Builder::get(&local_29c0,(Builder *)&stack0x00000008,name_05);
  local_29f0._0_8_ = 0xf6b75ab2bc471c7;
  local_29f0._8_8_ = (uchar *)0xf0948a54d43b8e39;
  local_29f0._16_8_ = local_29f0;
  local_29f0._24_8_ = 2;
  expected_18._M_len = local_29f0._40_8_;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Builder>
            ((_ *)&local_29c0,(Builder *)local_29f0._16_8_,expected_18);
  DynamicValue::Builder::~Builder(&local_29c0);
  kj::StringPtr::StringPtr(&local_2a40,"uInt8List");
  name_04.content.size_ = local_2a40.content.size_;
  name_04.content.ptr = local_2a40.content.ptr;
  DynamicStruct::Builder::get(&local_2a30,(Builder *)&stack0x00000008,name_04);
  local_2a52[0] = 0x6f;
  local_2a52[1] = 0xde;
  local_2a52._2_8_ = local_2a52;
  local_2a52._10_8_ = 2;
  expected_19._M_len = local_2a40.content.size_;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Builder>
            ((_ *)&local_2a30,(Builder *)local_2a52._2_8_,expected_19);
  DynamicValue::Builder::~Builder(&local_2a30);
  kj::StringPtr::StringPtr(&local_2aa8,"uInt16List");
  name_03.content.size_ = local_2aa8.content.size_;
  name_03.content.ptr = local_2aa8.content.ptr;
  DynamicStruct::Builder::get(&local_2a98,(Builder *)&stack0x00000008,name_03);
  local_2abc._0_2_ = 0x8235;
  local_2abc._2_2_ = 0xad9c;
  local_2abc._4_8_ = local_2abc;
  local_2abc._12_8_ = 2;
  expected_20._M_len = local_2aa8.content.size_;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Builder>
            ((_ *)&local_2a98,(Builder *)local_2abc._4_8_,expected_20);
  DynamicValue::Builder::~Builder(&local_2a98);
  kj::StringPtr::StringPtr(&local_2b10,"uInt32List");
  name_02.content.size_ = local_2b10.content.size_;
  name_02.content.ptr = local_2b10.content.ptr;
  DynamicStruct::Builder::get(&local_2b00,(Builder *)&stack0x00000008,name_02);
  local_2b24._0_4_ = 0xc6aea155;
  local_2b24._4_8_ = local_2b24;
  local_2b24._12_8_ = 1;
  expected_21._M_len = local_2b10.content.size_;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Builder>
            ((_ *)&local_2b00,(Builder *)local_2b24._4_8_,expected_21);
  DynamicValue::Builder::~Builder(&local_2b00);
  kj::StringPtr::StringPtr(&local_2b78,"uInt64List");
  name_01.content.size_ = local_2b78.content.size_;
  name_01.content.ptr = local_2b78.content.ptr;
  DynamicStruct::Builder::get(&local_2b68,(Builder *)&stack0x00000008,name_01);
  listReader_1.builder.structDataSize = 0xb5ac71c7;
  listReader_1.builder.structPointerCount = 0x98af;
  listReader_1.builder.elementSize = 0x32;
  listReader_1.builder._39_1_ = 0x9a;
  expected_22._M_len = local_2b78.content.size_;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Builder>
            ((_ *)&local_2b68,(Builder *)&listReader_1.builder.structDataSize,expected_22);
  DynamicValue::Builder::~Builder(&local_2b68);
  kj::StringPtr::StringPtr((StringPtr *)&f_1,"float32List");
  DynamicStruct::Builder::get(&local_2c08,(Builder *)&stack0x00000008,(StringPtr)_f_1);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_2bc8,&local_2c08);
  DynamicValue::Builder::~Builder(&local_2c08);
  uVar9 = DynamicList::Builder::size((Builder *)local_2bc8);
  if (uVar9 != 4) {
    local_2c24 = 4;
    local_2c28 = DynamicList::Builder::size((Builder *)local_2bc8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2c20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19e,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",&local_2c24,
               &local_2c28);
    kj::_::Debug::Fault::fatal(&local_2c20);
  }
  DynamicList::Builder::operator[]((Builder *)local_2c68,(Builder *)local_2bc8,0);
  BVar12 = DynamicValue::Builder::as<float>((Builder *)local_2c68);
  DynamicValue::Builder::~Builder((Builder *)local_2c68);
  if ((BVar12 != 5555.5) || (NAN(BVar12))) {
    local_2c69 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c69 != false) {
      local_2c70 = 5555.5;
      DynamicList::Builder::operator[](&local_2cb8,(Builder *)local_2bc8,0);
      local_2c74 = DynamicValue::Builder::as<float>(&local_2cb8);
      kj::_::Debug::log<char_const(&)[67],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x19f,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", 5555.5f, listReader[0].template as<float>()"
                 ,(char (*) [67])
                  "failed: expected (5555.5f) == (listReader[0].template as<float>())",&local_2c70,
                 &local_2c74);
      DynamicValue::Builder::~Builder(&local_2cb8);
      local_2c69 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Builder::operator[]((Builder *)local_2cf8,(Builder *)local_2bc8,1);
  BVar12 = DynamicValue::Builder::as<float>((Builder *)local_2cf8);
  DynamicValue::Builder::~Builder((Builder *)local_2cf8);
  if ((fVar13 != BVar12) || (NAN(fVar13) || NAN(BVar12))) {
    local_2cf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2cf9 != false) {
      local_2d00 = kj::inf();
      DynamicList::Builder::operator[](&local_2d48,(Builder *)local_2bc8,1);
      local_2d04 = DynamicValue::Builder::as<float>(&local_2d48);
      kj::_::Debug::log<char_const(&)[69],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a0,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", kj::inf(), listReader[1].template as<float>()"
                 ,(char (*) [69])
                  "failed: expected (kj::inf()) == (listReader[1].template as<float>())",&local_2d00
                 ,&local_2d04);
      DynamicValue::Builder::~Builder(&local_2d48);
      local_2cf9 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Builder::operator[]((Builder *)local_2d88,(Builder *)local_2bc8,2);
  BVar12 = DynamicValue::Builder::as<float>((Builder *)local_2d88);
  DynamicValue::Builder::~Builder((Builder *)local_2d88);
  if ((-fVar13 != BVar12) || (NAN(-fVar13) || NAN(BVar12))) {
    local_2d89 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d89 != false) {
      local_2d90 = kj::inf();
      local_2d90 = -local_2d90;
      DynamicList::Builder::operator[](&local_2dd8,(Builder *)local_2bc8,2);
      local_2d94 = DynamicValue::Builder::as<float>(&local_2dd8);
      kj::_::Debug::log<char_const(&)[70],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a1,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", -kj::inf(), listReader[2].template as<float>()"
                 ,(char (*) [70])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                 &local_2d90,&local_2d94);
      DynamicValue::Builder::~Builder(&local_2dd8);
      local_2d89 = false;
    }
  }
  DynamicList::Builder::operator[]((Builder *)local_2e18,(Builder *)local_2bc8,3);
  BVar12 = DynamicValue::Builder::as<float>((Builder *)local_2e18);
  bVar1 = isNaN(BVar12);
  DynamicValue::Builder::~Builder((Builder *)local_2e18);
  if (!bVar1) {
    listReader_2.builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (listReader_2.builder._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a2,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<float>())\"",
                 (char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())");
      listReader_2.builder._39_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_2,"float64List");
  DynamicStruct::Builder::get(&local_2e98,(Builder *)&stack0x00000008,(StringPtr)_f_2);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_2e58,&local_2e98);
  DynamicValue::Builder::~Builder(&local_2e98);
  uVar9 = DynamicList::Builder::size((Builder *)local_2e58);
  if (uVar9 != 4) {
    local_2eb4 = 4;
    local_2eb8 = DynamicList::Builder::size((Builder *)local_2e58);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2eb0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a6,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",&local_2eb4,
               &local_2eb8);
    kj::_::Debug::Fault::fatal(&local_2eb0);
  }
  DynamicList::Builder::operator[]((Builder *)local_2ef8,(Builder *)local_2e58,0);
  BVar14 = DynamicValue::Builder::as<double>((Builder *)local_2ef8);
  DynamicValue::Builder::~Builder((Builder *)local_2ef8);
  if ((BVar14 != 7777.75) || (NAN(BVar14))) {
    local_2ef9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2ef9 != false) {
      local_2f08 = 7777.75;
      DynamicList::Builder::operator[](&local_2f50,(Builder *)local_2e58,0);
      local_2f10 = DynamicValue::Builder::as<double>(&local_2f50);
      kj::_::Debug::log<char_const(&)[68],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a7,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", 7777.75, listReader[0].template as<double>()"
                 ,(char (*) [68])
                  "failed: expected (7777.75) == (listReader[0].template as<double>())",&local_2f08,
                 &local_2f10);
      DynamicValue::Builder::~Builder(&local_2f50);
      local_2ef9 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Builder::operator[]((Builder *)local_2f90,(Builder *)local_2e58,1);
  BVar14 = DynamicValue::Builder::as<double>((Builder *)local_2f90);
  DynamicValue::Builder::~Builder((Builder *)local_2f90);
  if (((double)fVar13 != BVar14) || (NAN((double)fVar13) || NAN(BVar14))) {
    local_2f91 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f91 != false) {
      local_2f98 = kj::inf();
      DynamicList::Builder::operator[](&local_2fe0,(Builder *)local_2e58,1);
      local_2fa0 = DynamicValue::Builder::as<double>(&local_2fe0);
      kj::_::Debug::log<char_const(&)[70],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a8,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", kj::inf(), listReader[1].template as<double>()"
                 ,(char (*) [70])
                  "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                 &local_2f98,&local_2fa0);
      DynamicValue::Builder::~Builder(&local_2fe0);
      local_2f91 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Builder::operator[]((Builder *)local_3020,(Builder *)local_2e58,2);
  BVar14 = DynamicValue::Builder::as<double>((Builder *)local_3020);
  DynamicValue::Builder::~Builder((Builder *)local_3020);
  if (((double)-fVar13 != BVar14) || (NAN((double)-fVar13) || NAN(BVar14))) {
    local_3021 = kj::_::Debug::shouldLog(ERROR);
    while (local_3021 != false) {
      local_3028 = kj::inf();
      local_3028 = -local_3028;
      DynamicList::Builder::operator[](&local_3070,(Builder *)local_2e58,2);
      local_3030 = DynamicValue::Builder::as<double>(&local_3070);
      kj::_::Debug::log<char_const(&)[71],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a9,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", -kj::inf(), listReader[2].template as<double>()"
                 ,(char (*) [71])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                 &local_3028,&local_3030);
      DynamicValue::Builder::~Builder(&local_3070);
      local_3021 = false;
    }
  }
  DynamicList::Builder::operator[]((Builder *)local_30b0,(Builder *)local_2e58,3);
  BVar14 = DynamicValue::Builder::as<double>((Builder *)local_30b0);
  bVar1 = isNaN(BVar14);
  DynamicValue::Builder::~Builder((Builder *)local_30b0);
  if (!bVar1) {
    local_30b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_30b1 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1aa,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<double>())\""
                 ,(char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())");
      local_30b1 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_3108,"textList");
  name_00.content.size_ = local_3108.content.size_;
  name_00.content.ptr = local_3108.content.ptr;
  DynamicStruct::Builder::get(&local_30f8,(Builder *)&stack0x00000008,name_00);
  Text::Reader::Reader((Reader *)local_3148,"plugh");
  Text::Reader::Reader((Reader *)(local_3148 + 0x10),"xyzzy");
  Text::Reader::Reader(local_3128,"thud");
  local_3128[1].super_StringPtr.content.ptr = local_3148;
  local_3128[1].super_StringPtr.content.size_ = 3;
  expected_23._M_len = local_3108.content.size_;
  expected_23._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Builder>
            ((_ *)&local_30f8,(Builder *)local_3128[1].super_StringPtr.content.ptr,expected_23);
  DynamicValue::Builder::~Builder(&local_30f8);
  kj::StringPtr::StringPtr((StringPtr *)&local_3198,"dataList");
  DynamicStruct::Builder::get(&local_3188,(Builder *)&stack0x00000008,(StringPtr)local_3198);
  RVar18 = _::data("oops");
  listReader_3.builder._32_8_ = RVar18.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("exhausted");
  RVar18 = _::data("rfc3092");
  expected_24._M_len = RVar18.super_ArrayPtr<const_unsigned_char>.size_;
  expected_24._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Builder>
            ((_ *)&local_3188,(Builder *)&listReader_3.builder.structDataSize,expected_24);
  DynamicValue::Builder::~Builder(&local_3188);
  kj::StringPtr::StringPtr((StringPtr *)&f_3,"structList");
  DynamicStruct::Builder::get(&local_3250,(Builder *)&stack0x00000008,(StringPtr)_f_3);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_3210,&local_3250);
  DynamicValue::Builder::~Builder(&local_3250);
  uVar9 = DynamicList::Builder::size((Builder *)local_3210);
  if (uVar9 != 3) {
    local_326c = 3;
    local_3270 = DynamicList::Builder::size((Builder *)local_3210);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3268,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b0,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_326c,
               &local_3270);
    kj::_::Debug::Fault::fatal(&local_3268);
  }
  DynamicList::Builder::operator[](&local_3338,(Builder *)local_3210,0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_32f8,&local_3338);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3348,"textField");
  DynamicStruct::Builder::get(&local_32c8,&local_32f8,(StringPtr)_auStack_3348);
  DynamicValue::Builder::as<capnp::Text>(&local_3288,&local_32c8);
  bVar1 = capnp::operator==("structlist 1",&local_3288);
  DynamicValue::Builder::~Builder(&local_32c8);
  DynamicValue::Builder::~Builder(&local_3338);
  if (!bVar1) {
    local_3349 = kj::_::Debug::shouldLog(ERROR);
    while (local_3349 != false) {
      DynamicList::Builder::operator[](&local_3418,(Builder *)local_3210,0);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_33d8,&local_3418);
      kj::StringPtr::StringPtr((StringPtr *)&local_3428,"textField");
      DynamicStruct::Builder::get(&local_33a8,&local_33d8,(StringPtr)local_3428);
      DynamicValue::Builder::as<capnp::Text>(&local_3368,&local_33a8);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b1,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4cc378,&local_3368);
      DynamicValue::Builder::~Builder(&local_33a8);
      DynamicValue::Builder::~Builder(&local_3418);
      local_3349 = false;
    }
  }
  DynamicList::Builder::operator[](&local_34f0,(Builder *)local_3210,1);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_34b0,&local_34f0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3500,"textField");
  DynamicStruct::Builder::get(&local_3480,&local_34b0,(StringPtr)_auStack_3500);
  DynamicValue::Builder::as<capnp::Text>(&local_3440,&local_3480);
  bVar1 = capnp::operator==("structlist 2",&local_3440);
  DynamicValue::Builder::~Builder(&local_3480);
  DynamicValue::Builder::~Builder(&local_34f0);
  if (!bVar1) {
    local_3501 = kj::_::Debug::shouldLog(ERROR);
    while (local_3501 != false) {
      DynamicList::Builder::operator[](&local_35d0,(Builder *)local_3210,1);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3590,&local_35d0);
      kj::StringPtr::StringPtr((StringPtr *)&local_35e0,"textField");
      DynamicStruct::Builder::get(&local_3560,&local_3590,(StringPtr)local_35e0);
      DynamicValue::Builder::as<capnp::Text>(&local_3520,&local_3560);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b2,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4bd3b4,&local_3520);
      DynamicValue::Builder::~Builder(&local_3560);
      DynamicValue::Builder::~Builder(&local_35d0);
      local_3501 = false;
    }
  }
  DynamicList::Builder::operator[](&local_36a8,(Builder *)local_3210,2);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3668,&local_36a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_36b8,"textField");
  DynamicStruct::Builder::get(&local_3638,&local_3668,(StringPtr)_auStack_36b8);
  DynamicValue::Builder::as<capnp::Text>(&local_35f8,&local_3638);
  bVar1 = capnp::operator==("structlist 3",&local_35f8);
  DynamicValue::Builder::~Builder(&local_3638);
  DynamicValue::Builder::~Builder(&local_36a8);
  if (!bVar1) {
    local_36b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_36b9 != false) {
      DynamicList::Builder::operator[](&local_3788,(Builder *)local_3210,2);
      DynamicValue::Builder::as<capnp::DynamicStruct>(&local_3748,&local_3788);
      kj::StringPtr::StringPtr((StringPtr *)&local_3798,"textField");
      DynamicStruct::Builder::get(&local_3718,&local_3748,(StringPtr)local_3798);
      DynamicValue::Builder::as<capnp::Text>(&local_36d8,&local_3718);
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b3,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4cc51c,&local_36d8);
      DynamicValue::Builder::~Builder(&local_3718);
      DynamicValue::Builder::~Builder(&local_3788);
      local_36b9 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_37e8,"enumList");
  name.content.size_ = local_37e8.content.size_;
  name.content.ptr = local_37e8.content.ptr;
  DynamicStruct::Builder::get(&local_37d8,(Builder *)&stack0x00000008,name);
  local_3808 = "foo";
  local_3800 = "garply";
  local_37f8 = &local_3808;
  local_37f0 = 2;
  expected_25._M_len = local_37e8.content.size_;
  expected_25._M_array = (iterator)0x2;
  checkEnumList<capnp::DynamicValue::Builder>
            ((anon_unknown_130 *)&local_37d8,(Builder *)local_37f8,expected_25);
  DynamicValue::Builder::~Builder(&local_37d8);
  return;
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}